

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O2

int flatcc_verify_table_as_root_with_size
              (void *buf,size_t bufsiz,char *fid,flatcc_table_verifier_f *tvf)

{
  int iVar1;
  size_t bufsiz_local;
  
  bufsiz_local = bufsiz;
  iVar1 = flatcc_verify_buffer_header_with_size(buf,&bufsiz_local,fid);
  if (iVar1 != 0) {
    iVar1 = flatcc_verify_buffer_header_with_size(buf,&bufsiz_local,fid);
    return iVar1;
  }
  iVar1 = verify_table(buf,(flatbuffers_uoffset_t)bufsiz_local,4,
                       *(flatbuffers_uoffset_t *)((long)buf + 4),100,tvf);
  return iVar1;
}

Assistant:

int flatcc_verify_table_as_root_with_size(const void *buf, size_t bufsiz, const char *fid, flatcc_table_verifier_f *tvf)
{
    check_result(flatcc_verify_buffer_header_with_size(buf, &bufsiz, fid));
    return verify_table(buf, (uoffset_t)bufsiz, uoffset_size, read_uoffset(buf, uoffset_size), FLATCC_VERIFIER_MAX_LEVELS, tvf);
}